

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TN93.cpp
# Opt level: O2

void dump_histogram(ostream *outStream,char *tag,unsigned_long *hist)

{
  ostream *poVar1;
  char *pcVar2;
  unsigned_long k;
  long lVar3;
  
  if (tag == (char *)0x0) {
    pcVar2 = "\t\"Histogram\" : [";
    poVar1 = outStream;
  }
  else {
    poVar1 = std::operator<<(outStream,"\t\"Histogram ");
    poVar1 = std::operator<<(poVar1,tag);
    pcVar2 = "\" : [";
  }
  std::operator<<(poVar1,pcVar2);
  lVar3 = 0;
  do {
    if (lVar3 != 0) {
      if (lVar3 == 200) {
        poVar1 = std::operator<<(outStream,"]");
        std::endl<char,std::char_traits<char>>(poVar1);
        return;
      }
      std::operator<<(outStream,',');
    }
    std::operator<<(outStream,'[');
    poVar1 = std::ostream::_M_insert<double>(((double)lVar3 + 1.0) / 200.0);
    poVar1 = std::operator<<(poVar1,',');
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,']');
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void dump_histogram(ostream *outStream, const char *tag, unsigned long *hist) {
  if (tag) {
    (*outStream) << "\t\"Histogram " << tag << "\" : [";
  } else {
    (*outStream) << "\t\"Histogram\" : [";
  }
  for (unsigned long k = 0; k < HISTOGRAM_BINS; k++) {
    if (k) {
      (*outStream) << ',';
    }
    (*outStream) << '[' << (k + 1.) / HISTOGRAM_BINS << ',' << hist[k] << ']';
  }
  (*outStream) << "]" << endl;
}